

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::handleUnexpectedEOF(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  bool bVar2;
  QHttpNetworkConnectionPrivate *pQVar3;
  pointer this_00;
  int in_ESI;
  QHttpNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff78;
  QHttpNetworkReplyPrivate *in_stack_ffffffffffffff80;
  QHttpNetworkConnectionChannel *this_01;
  ConnectionType c;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff90;
  _func_int **member;
  QHttpNetworkRequest *in_stack_ffffffffffffff98;
  QHttpNetworkRequestPrivate *obj;
  QHttpNetworkRequest *pQVar4;
  NetworkError errorCode;
  QUrl in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  if ((*(int *)((long)&in_RDI[5].d.d.ptr + 4) < 1) ||
     (bVar2 = QHttpNetworkRequest::methodIsIdempotent(in_stack_ffffffffffffff98), !bVar2)) {
    errorCode = (NetworkError)((ulong)pQVar4 >> 0x20);
    requeueCurrentlyPipelinedRequests(in_stack_ffffffffffffff90);
    close((QHttpNetworkConnectionChannel *)in_RDI,in_ESI);
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f93ac);
    pQVar3 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f93b4);
    c = (ConnectionType)((ulong)pQVar3 >> 0x20);
    member = in_RDI[1].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
    QString::QString((QString *)0x2f93d4);
    QHttpNetworkConnectionPrivate::errorDetail
              ((QHttpNetworkConnectionPrivate *)in_stack_ffffffffffffffb0.d,errorCode,
               (QIODevice *)in_RDI,(QString *)in_stack_ffffffffffffff98);
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2f9400);
    QString::operator=((QString *)in_stack_ffffffffffffff80,(QString *)in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x2f941e);
    QString::~QString((QString *)0x2f9428);
    obj = in_RDI[3].d.d.ptr;
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2f943f);
    QHttpNetworkReply::finishedWithError
              ((QHttpNetworkReply *)in_stack_ffffffffffffff80,c,(QString *)in_stack_ffffffffffffff78
              );
    in_RDI[3].d.d.ptr = (QHttpNetworkRequestPrivate *)0x0;
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                        *)0x2f946e);
    if (bVar2) {
      this_00 = std::
                unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                ::operator->((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                              *)0x2f9482);
      QAbstractProtocolHandler::setReply(this_00,(QHttpNetworkReply *)0x0);
    }
    QUrl::QUrl((QUrl *)&stack0xffffffffffffffb0);
    QHttpNetworkRequest::QHttpNetworkRequest
              (in_RDI,(QUrl *)obj,(Operation)((ulong)member >> 0x20),(Priority)member);
    QHttpNetworkRequest::operator=
              ((QHttpNetworkRequest *)in_stack_ffffffffffffff80,
               (QHttpNetworkRequest *)in_stack_ffffffffffffff78);
    QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)in_stack_ffffffffffffff80);
    QUrl::~QUrl((QUrl *)&stack0xffffffffffffffb0);
    QPointer::operator_cast_to_QHttpNetworkConnection_((QPointer<QHttpNetworkConnection> *)0x2f94e6)
    ;
    QMetaObject::invokeMethod<>((QObject *)obj,(char *)member,c);
  }
  else {
    *(int *)((long)&in_RDI[5].d.d.ptr + 4) = *(int *)((long)&in_RDI[5].d.d.ptr + 4) + -1;
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2f9513);
    QHttpNetworkReplyPrivate::clear(in_stack_ffffffffffffff80);
    this_01 = (QHttpNetworkConnectionChannel *)(in_RDI + 0xf);
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2f9538);
    QPointer<QHttpNetworkConnection>::operator=
              ((QPointer<QHttpNetworkConnection> *)this_01,
               (QPointer<QHttpNetworkConnection> *)in_stack_ffffffffffffff78);
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2f955a);
    QPointer<QHttpNetworkConnectionChannel>::operator=
              ((QPointer<QHttpNetworkConnectionChannel> *)this_01,in_stack_ffffffffffffff78);
    closeAndResendCurrentRequest(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::handleUnexpectedEOF()
{
    Q_ASSERT(reply);
    if (reconnectAttempts <= 0 || !request.methodIsIdempotent()) {
        // too many errors reading/receiving/parsing the status, close the socket and emit error
        requeueCurrentlyPipelinedRequests();
        close();
        reply->d_func()->errorString = connection->d_func()->errorDetail(QNetworkReply::RemoteHostClosedError, socket);
        emit reply->finishedWithError(QNetworkReply::RemoteHostClosedError, reply->d_func()->errorString);
        reply = nullptr;
        if (protocolHandler)
            protocolHandler->setReply(nullptr);
        request = QHttpNetworkRequest();
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        reconnectAttempts--;
        reply->d_func()->clear();
        reply->d_func()->connection = connection;
        reply->d_func()->connectionChannel = this;
        closeAndResendCurrentRequest();
    }
}